

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeFirstAlgorithm.cpp
# Opt level: O1

void __thiscall
van_kampen::LargeFirstAlgorithm::generate
          (LargeFirstAlgorithm *this,
          vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
          *words)

{
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *pvVar1;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *pvVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  size_t sVar6;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *pvVar7;
  ostream *poVar8;
  iterator iVar9;
  long lVar10;
  iterator it;
  ulong uVar11;
  ulong total;
  int iVar12;
  iterator it_00;
  bool bVar13;
  bool force;
  bool oneAdded;
  vector<bool,_std::allocator<bool>_> isAdded;
  anon_class_48_6_f85bbd33 add;
  anon_class_16_2_0b5c3d9c added;
  ProcessLogger logger;
  char local_11a;
  bool local_119;
  LargeFirstAlgorithm *local_118;
  vector<bool,_std::allocator<bool>_> local_110;
  size_t local_e8;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  *local_e0;
  int local_d4;
  undefined1 local_d0 [32];
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  *local_b0;
  bool *local_a8;
  vector<bool,_std::allocator<bool>_> *local_a0;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  *local_98;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> local_90;
  ProcessLogger local_78;
  
  uVar5 = ((long)(words->
                 super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(words->
                 super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar11 = this->cellsLimit;
  total = uVar5;
  if (uVar11 < uVar5) {
    total = uVar11;
  }
  if (uVar11 == 0) {
    total = uVar5;
  }
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Relations used","");
  ProcessLogger::ProcessLogger(&local_78,total,(ostream *)&std::clog,(string *)local_d0,this->quiet)
  ;
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  local_d0._0_8_ = local_d0._0_8_ & 0xffffffffffffff00;
  local_118 = this;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_110,
             ((long)(words->
                    super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(words->
                    super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (bool *)local_d0,(allocator_type *)&local_a0);
  local_a0 = &local_110;
  local_98 = words;
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::vector
            (&local_90,
             (words->
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1);
  Diagramm::bindWord(&local_118->diagramm_,&local_90,false,true);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
            (&local_90);
  uVar11 = (ulong)local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
  uVar5 = (ulong)local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e;
  if (-1 < (long)uVar11) {
    uVar5 = uVar11;
  }
  local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p
  [((long)uVar5 >> 6) + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
       local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p
       [((long)uVar5 >> 6) + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
       1L << ((byte)uVar11 & 0x3f);
  ProcessLogger::iterate(&local_78);
  local_a8 = &local_119;
  local_119 = false;
  local_d0._16_8_ = &local_11a;
  local_11a = '\0';
  local_d0._8_8_ = local_118;
  it._M_current =
       (words->
       super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  it_00._M_current =
       (words->
       super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish + -2;
  local_e8 = total;
  local_e0 = words;
  local_d0._0_8_ = (allocator_type *)&local_a0;
  local_d0._24_8_ = &local_110;
  local_b0 = words;
  do {
    do {
      iVar12 = local_118->maximalSmallForOneBig;
      iVar9._M_current = it._M_current;
      local_d4 = iVar12;
LAB_0014e938:
      it._M_current = iVar9._M_current;
      bVar4 = generate::anon_class_48_6_f85bbd33::operator()
                        ((anon_class_48_6_f85bbd33 *)local_d0,it_00);
      if (!bVar4) {
        bVar13 = iVar12 == 0;
        iVar12 = iVar12 + -1;
        if (bVar13 && local_d4 != 0) {
          if (!bVar4) goto LAB_0014ea2d;
          goto LAB_0014ea15;
        }
        bVar4 = generate::anon_class_48_6_f85bbd33::operator()
                          ((anon_class_48_6_f85bbd33 *)local_d0,it);
        if ((bVar4) && (sVar6 = ProcessLogger::iterate(&local_78), local_e8 <= sVar6))
        goto LAB_0014ebf3;
        iVar9._M_current = it._M_current + 1;
        pvVar1 = (local_e0->
                 super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current < pvVar1) {
          lVar10 = (long)it._M_current -
                   (long)(local_e0->
                         super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
          do {
            lVar10 = lVar10 + 0x18;
            uVar11 = (lVar10 >> 3) * -0x5555555555555555;
            if ((local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [lVar10 / 0x600 + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)
                 ] >> (uVar11 & 0x3f) & 1) == 0) break;
            iVar9._M_current = iVar9._M_current + 1;
          } while (iVar9._M_current < pvVar1);
        }
        goto LAB_0014e938;
      }
LAB_0014ea15:
      sVar6 = ProcessLogger::iterate(&local_78);
      if (local_e8 <= sVar6) goto LAB_0014ebf3;
LAB_0014ea2d:
      pvVar1 = (local_e0->
               super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)(it_00._M_current + -1) - (long)pvVar1;
      pvVar2 = it_00._M_current + -1;
      do {
        it_00._M_current = pvVar2;
        if (it_00._M_current < pvVar1) break;
        uVar11 = (lVar10 >> 3) * -0x5555555555555555;
        lVar3 = lVar10 / 0x600;
        lVar10 = lVar10 + -0x18;
        pvVar2 = it_00._M_current + -1;
      } while ((local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [lVar3 + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                (uVar11 & 0x3f) & 1) != 0);
    } while (it._M_current < it_00._M_current);
    pvVar2 = (local_e0->
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    it._M_current = pvVar1;
    if (pvVar1 < pvVar2) {
      lVar10 = 0;
      do {
        uVar11 = (lVar10 >> 3) * -0x5555555555555555;
        if ((local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [lVar10 / 0x600 + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
             (uVar11 & 0x3f) & 1) == 0) break;
        pvVar7 = (vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
                 ((long)&pvVar1[1].
                         super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar10);
        lVar10 = lVar10 + 0x18;
      } while (pvVar7 < pvVar2);
      it._M_current =
           (vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
           ((long)&(pvVar1->
                   super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar10);
    }
    lVar10 = (long)(pvVar2 + -1) - (long)pvVar1;
    pvVar2 = pvVar2 + -1;
    do {
      it_00._M_current = pvVar2;
      if (it_00._M_current < pvVar1) break;
      uVar11 = (lVar10 >> 3) * -0x5555555555555555;
      lVar3 = lVar10 / 0x600;
      lVar10 = lVar10 + -0x18;
      pvVar2 = it_00._M_current + -1;
    } while ((local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [lVar3 + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
              (uVar11 & 0x3f) & 1) != 0);
    if (local_119 == false) {
      if ((local_11a == '\x01') && (local_118->quiet == false)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"can not bind ",0xd);
        ProcessLogger::getIteration(&local_78);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," relations, finishing",0x15);
LAB_0014ebf3:
        if (local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        ProcessLogger::~ProcessLogger(&local_78);
        return;
      }
      local_11a = '\x01';
    }
    local_119 = false;
  } while( true );
}

Assistant:

void LargeFirstAlgorithm::generate(const std::vector<std::vector<GroupElement>> &words)
{
    std::size_t totalIterations = words.size();
    if (cellsLimit)
    {
        totalIterations = std::min(totalIterations, cellsLimit);
    }
    ProcessLogger logger(totalIterations, std::clog, "Relations used", quiet);

    std::vector<bool> isAdded(words.size());
    using iterator = std::vector<std::vector<GroupElement>>::const_iterator;
    auto added = [&](iterator it) {
        return isAdded[it - begin(words)];
    };
    diagramm_.bindWord(words.back(), false, true);
    isAdded.back() = true;
    logger.iterate();
    bool oneAdded = false;
    bool force = false;
    auto add = [&](iterator it) {
        if (added(it))
        {
            throw std::logic_error("trying to add already added word");
        }
        if (diagramm_.bindWord(*it, force, false))
        {
            isAdded[it - begin(words)] = true;
            oneAdded = true;
            return true;
        }
        return false;
    };
    auto smallIt = words.begin();
    auto bigIt = prev(prev(words.end()));
    auto nextNotAdded = [&](iterator it) {
        while (it < end(words) && isAdded[it - begin(words)])
            ++it;
        return it;
    };
    auto prevNotAdded = [&](iterator it) {
        while (--it >= begin(words) && isAdded[it - begin(words)])
            ;
        return it;
    };
    while (true)
    {
        int rest = maximalSmallForOneBig;
        bool infinite = rest == 0;
        bool success = true;
        while (!add(bigIt))
        {
            if (rest-- == 0 && !infinite)
            {
                success = false;
                break;
            }

            if (add(smallIt) && logger.iterate() >= totalIterations)
                return;

            smallIt = nextNotAdded(smallIt + 1);
        }

        if (success && logger.iterate() >= totalIterations)
            return;

        bigIt = prevNotAdded(bigIt);
        if (smallIt >= bigIt)
        {
            smallIt = nextNotAdded(begin(words));
            bigIt = prevNotAdded(words.end());

            if (!oneAdded)
            {
                if (force && !quiet)
                {
                    if (!quiet)
                        std::clog << "can not bind " << totalIterations - logger.getIteration() << " relations, finishing";
                    return;
                }
                force = true;
            }
            oneAdded = false;
        }
    }
}